

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_thread_loop_filter_rows
               (YV12_BUFFER_CONFIG *frame_buffer,AV1_COMMON *cm,macroblockd_plane *planes,
               MACROBLOCKD *xd,int mi_row,int plane,int dir,int lpf_opt_level,AV1LfSync *lf_sync,
               aom_internal_error_info *error_info,AV1_DEBLOCKING_PARAMETERS *params_buf,
               TX_SIZE *tx_buf,int num_mis_in_lpf_unit_height_log2)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool joint_filter_chroma;
  int iVar6;
  uint mi_col;
  int iVar7;
  pthread_mutex_t *ppVar8;
  uint uVar9;
  uint32_t mi_col_00;
  
  iVar6 = mi_row >> ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  joint_filter_chroma = 0 < plane && lpf_opt_level == 2;
  if (dir == 0) {
    if (0 < (cm->mi_params).mi_cols) {
      iVar5 = (cm->mi_params).mi_cols + 0x1f >> 5;
      iVar3 = iVar5 + -1;
      iVar4 = 0;
      mi_col_00 = 0;
      do {
        av1_setup_dst_planes
                  (planes,cm->seq_params->sb_size,frame_buffer,mi_row,mi_col_00,plane,
                   joint_filter_chroma + 1 + plane);
        if (lpf_opt_level == 0) {
          av1_filter_block_plane_vert(cm,xd,plane,planes + plane,mi_row,mi_col_00);
        }
        else if (plane == 0) {
          av1_filter_block_plane_vert_opt
                    (cm,xd,planes,mi_row,mi_col_00,params_buf,tx_buf,num_mis_in_lpf_unit_height_log2
                    );
        }
        else {
          av1_filter_block_plane_vert_opt_chroma
                    (cm,xd,planes + plane,mi_row,mi_col_00,params_buf,tx_buf,plane,
                     joint_filter_chroma,num_mis_in_lpf_unit_height_log2);
        }
        if (lf_sync != (AV1LfSync *)0x0) {
          iVar7 = iVar4;
          if (iVar3 <= iVar4) {
            iVar7 = lf_sync->sync_range + iVar5;
          }
          if (iVar3 <= iVar4 || iVar4 % lf_sync->sync_range == 0) {
            pthread_mutex_lock((pthread_mutex_t *)(lf_sync->mutex_[plane] + iVar6));
            iVar2 = lf_sync->cur_sb_col[plane][iVar6];
            if (iVar7 < iVar2) {
              iVar7 = iVar2;
            }
            lf_sync->cur_sb_col[plane][iVar6] = iVar7;
            pthread_cond_broadcast((pthread_cond_t *)(lf_sync->cond_[plane] + iVar6));
            pthread_mutex_unlock((pthread_mutex_t *)(lf_sync->mutex_[plane] + iVar6));
          }
        }
        mi_col_00 = mi_col_00 + 0x20;
        iVar4 = iVar4 + 1;
      } while ((int)mi_col_00 < (cm->mi_params).mi_cols);
    }
  }
  else if ((dir == 1) && (0 < (cm->mi_params).mi_cols)) {
    iVar3 = iVar6 + -1;
    mi_col = 0;
    do {
      if (lf_sync != (AV1LfSync *)0x0) {
        uVar9 = mi_col >> 5;
        if ((iVar6 != 0) && (iVar5 = lf_sync->sync_range, (iVar5 + 0x3ffffffU & uVar9) == 0)) {
          ppVar8 = lf_sync->mutex_[plane] + iVar3;
          pthread_mutex_lock((pthread_mutex_t *)ppVar8);
          iVar4 = lf_sync->cur_sb_col[plane][iVar3] - iVar5;
          while (iVar4 < (int)uVar9) {
            pthread_cond_wait((pthread_cond_t *)(lf_sync->cond_[plane] + iVar3),
                              (pthread_mutex_t *)ppVar8);
            iVar4 = lf_sync->cur_sb_col[plane][iVar3] - iVar5;
          }
          pthread_mutex_unlock((pthread_mutex_t *)ppVar8);
        }
        if ((iVar6 != -1) && (iVar5 = lf_sync->sync_range, (iVar5 + 0x3ffffffU & uVar9) == 0)) {
          ppVar8 = lf_sync->mutex_[plane] + iVar6;
          pthread_mutex_lock((pthread_mutex_t *)ppVar8);
          iVar4 = lf_sync->cur_sb_col[plane][iVar6] - iVar5;
          while (iVar4 < (int)uVar9) {
            pthread_cond_wait((pthread_cond_t *)(lf_sync->cond_[plane] + iVar6),
                              (pthread_mutex_t *)ppVar8);
            iVar4 = lf_sync->cur_sb_col[plane][iVar6] - iVar5;
          }
          pthread_mutex_unlock((pthread_mutex_t *)ppVar8);
        }
        if (1 < lf_sync->num_workers) {
          pthread_mutex_lock((pthread_mutex_t *)lf_sync->job_mutex);
          _Var1 = lf_sync->lf_mt_exit;
          pthread_mutex_unlock((pthread_mutex_t *)lf_sync->job_mutex);
          if (_Var1 != false) {
            return;
          }
        }
      }
      av1_setup_dst_planes
                (planes,cm->seq_params->sb_size,frame_buffer,mi_row,mi_col,plane,
                 joint_filter_chroma + 1 + plane);
      if (lpf_opt_level == 0) {
        av1_filter_block_plane_horz(cm,xd,plane,planes + plane,mi_row,mi_col);
      }
      else if (plane == 0) {
        av1_filter_block_plane_horz_opt
                  (cm,xd,planes,mi_row,mi_col,params_buf,tx_buf,num_mis_in_lpf_unit_height_log2);
      }
      else {
        av1_filter_block_plane_horz_opt_chroma
                  (cm,xd,planes + plane,mi_row,mi_col,params_buf,tx_buf,plane,joint_filter_chroma,
                   num_mis_in_lpf_unit_height_log2);
      }
      mi_col = mi_col + 0x20;
    } while ((int)mi_col < (cm->mi_params).mi_cols);
  }
  return;
}

Assistant:

void av1_thread_loop_filter_rows(
    const YV12_BUFFER_CONFIG *const frame_buffer, AV1_COMMON *const cm,
    struct macroblockd_plane *planes, MACROBLOCKD *xd, int mi_row, int plane,
    int dir, int lpf_opt_level, AV1LfSync *const lf_sync,
    struct aom_internal_error_info *error_info,
    AV1_DEBLOCKING_PARAMETERS *params_buf, TX_SIZE *tx_buf,
    int num_mis_in_lpf_unit_height_log2) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, MAX_MIB_SIZE_LOG2);
  const int r = mi_row >> num_mis_in_lpf_unit_height_log2;
  int mi_col, c;

  const bool joint_filter_chroma = (lpf_opt_level == 2) && plane > AOM_PLANE_Y;
  const int num_planes = joint_filter_chroma ? 2 : 1;
  assert(IMPLIES(joint_filter_chroma, plane == AOM_PLANE_U));

  if (dir == 0) {
    for (mi_col = 0; mi_col < cm->mi_params.mi_cols; mi_col += MAX_MIB_SIZE) {
      c = mi_col >> MAX_MIB_SIZE_LOG2;

      av1_setup_dst_planes(planes, cm->seq_params->sb_size, frame_buffer,
                           mi_row, mi_col, plane, plane + num_planes);
      if (lpf_opt_level) {
        if (plane == AOM_PLANE_Y) {
          av1_filter_block_plane_vert_opt(cm, xd, &planes[plane], mi_row,
                                          mi_col, params_buf, tx_buf,
                                          num_mis_in_lpf_unit_height_log2);
        } else {
          av1_filter_block_plane_vert_opt_chroma(
              cm, xd, &planes[plane], mi_row, mi_col, params_buf, tx_buf, plane,
              joint_filter_chroma, num_mis_in_lpf_unit_height_log2);
        }
      } else {
        av1_filter_block_plane_vert(cm, xd, plane, &planes[plane], mi_row,
                                    mi_col);
      }
      if (lf_sync != NULL) {
        sync_write(lf_sync, r, c, sb_cols, plane);
      }
    }
  } else if (dir == 1) {
    for (mi_col = 0; mi_col < cm->mi_params.mi_cols; mi_col += MAX_MIB_SIZE) {
      c = mi_col >> MAX_MIB_SIZE_LOG2;

      if (lf_sync != NULL) {
        // Wait for vertical edge filtering of the top-right block to be
        // completed
        sync_read(lf_sync, r, c, plane);

        // Wait for vertical edge filtering of the right block to be completed
        sync_read(lf_sync, r + 1, c, plane);
      }

#if CONFIG_MULTITHREAD
      if (lf_sync && lf_sync->num_workers > 1) {
        pthread_mutex_lock(lf_sync->job_mutex);
        const bool lf_mt_exit = lf_sync->lf_mt_exit;
        pthread_mutex_unlock(lf_sync->job_mutex);
        // Exit in case any worker has encountered an error.
        if (lf_mt_exit) return;
      }
#endif

      av1_setup_dst_planes(planes, cm->seq_params->sb_size, frame_buffer,
                           mi_row, mi_col, plane, plane + num_planes);
      if (lpf_opt_level) {
        if (plane == AOM_PLANE_Y) {
          av1_filter_block_plane_horz_opt(cm, xd, &planes[plane], mi_row,
                                          mi_col, params_buf, tx_buf,
                                          num_mis_in_lpf_unit_height_log2);
        } else {
          av1_filter_block_plane_horz_opt_chroma(
              cm, xd, &planes[plane], mi_row, mi_col, params_buf, tx_buf, plane,
              joint_filter_chroma, num_mis_in_lpf_unit_height_log2);
        }
      } else {
        av1_filter_block_plane_horz(cm, xd, plane, &planes[plane], mi_row,
                                    mi_col);
      }
    }
  }
}